

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O2

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>
::operator()(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *psVar1;
  shared_ptr<fineftp::FtpSession::IoFile> *psVar2;
  state_type sVar3;
  socket_type sVar4;
  int iVar5;
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar6;
  void *pvVar7;
  service_type *psVar8;
  FtpSession *pFVar9;
  error_category *peVar10;
  __shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  element_type *peVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  element_type *peVar18;
  ulong uVar19;
  ulong __new_size;
  size_t sVar20;
  ulong uVar21;
  template_rebind_alloc<reactive_socket_recv_op<mutable_buffers_1,_read_op<basic_stream_socket<tcp>,_mutable_buffers_1,_const_mutable_buffer_*,_transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>,_any_executor<context_as_t<execution_context_&>,_never_t<0>,_prefer_only<possibly_t<>_>,_prefer_only<tracked_t<>_>,_prefer_only<untracked_t<>_>,_prefer_only<fork_t<>_>,_prefer_only<continuation_t<>_>_>_>_>
  a;
  _Any_data local_d8;
  __shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> _Stack_c8;
  __shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b8;
  undefined1 local_a8 [16];
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  executor_type *local_88;
  base_implementation_type *local_80;
  reactive_socket_service_base *local_78;
  __shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->start_ = start;
  __new_size = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.
               total_consumed_;
  if (start == 1) {
    sVar20 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
             super_mutable_buffer.size_;
    uVar19 = (ulong)(__new_size <
                     (this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).
                     completion_condition_.minimum_ && ec->_M_value == 0) << 0x10;
  }
  else {
    __new_size = __new_size + bytes_transferred;
    (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_ =
         __new_size;
    iVar5 = ec->_M_value;
    sVar20 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
             super_mutable_buffer.size_;
    if (((sVar20 <= __new_size || bytes_transferred == 0 && iVar5 == 0) || (iVar5 != 0)) ||
       ((this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).
        completion_condition_.minimum_ <= __new_size)) {
      psVar1 = &(this->handler_).buffer;
      fineftp::std::vector<char,_std::allocator<char>_>::resize
                ((this->handler_).buffer.
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,__new_size);
      if (iVar5 == 0) {
        if (__new_size == 0) {
          return;
        }
        p_Var11 = &local_60;
        pFVar9 = (this->handler_).me.
                 super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        fineftp::std::
        __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&local_60,
                     &psVar1->
                      super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
        psVar2 = &(this->handler_).file;
        fineftp::std::__shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_70,
                     &psVar2->
                      super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                   (__shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)&this->handler_)
        ;
        fineftp::std::__shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&_Stack_c8,
                     &psVar2->
                      super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>);
        fineftp::std::
        __shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_b8,
                       &(this->handler_).data_socket.
                        super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      );
        local_98 = (_Manager_type)0x0;
        p_Stack_90 = (_Invoker_type)0x0;
        local_a8._0_8_ = (element_type *)0x0;
        local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._0_8_ = operator_new(0x30);
        _Var17._M_pi = local_b8._M_refcount._M_pi;
        peVar16 = local_b8._M_ptr;
        _Var15._M_pi = _Stack_c8._M_refcount._M_pi;
        peVar18 = _Stack_c8._M_ptr;
        uVar14 = local_d8._8_8_;
        uVar13 = local_d8._M_unused._0_8_;
        local_d8._8_8_ = 0;
        local_d8._M_unused._M_object = (void *)0x0;
        _Stack_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_c8._M_ptr = (element_type *)0x0;
        local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined8 *)local_a8._0_8_ = uVar13;
        *(undefined8 *)&((element_type *)local_a8._0_8_)->field_0x8 = uVar14;
        local_b8._M_ptr = (element_type *)0x0;
        *(element_type **)&((element_type *)local_a8._0_8_)->field_0x10 = peVar18;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &((element_type *)local_a8._0_8_)->field_0x18 = _Var15._M_pi;
        *(element_type **)&((element_type *)local_a8._0_8_)->field_0x20 = peVar16;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &((element_type *)local_a8._0_8_)->field_0x28 = _Var17._M_pi;
        p_Stack_90 = fineftp::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1327:61)>
                     ::_M_invoke;
        local_98 = fineftp::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1327:61)>
                   ::_M_manager;
        fineftp::FtpSession::writeDataToFile
                  (pFVar9,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)&local_60,
                   (shared_ptr<fineftp::FtpSession::IoFile> *)&local_70,
                   (function<void_()> *)local_a8);
        std::_Function_base::~_Function_base((_Function_base *)local_a8);
        const::{lambda()#1}::~error_code((_lambda___1_ *)local_d8._M_pod_data);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_refcount);
      }
      else {
        if (__new_size != 0) {
          pFVar9 = (this->handler_).me.
                   super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          fineftp::std::
          __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&local_40,
                       &psVar1->
                        super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      );
          fineftp::std::__shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr((__shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2> *)
                       local_a8,&(this->handler_).file.
                                 super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>
                      );
          local_d8._M_unused._M_object = (void *)0x0;
          local_d8._8_8_ = 0;
          _Stack_c8._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               fineftp::std::
               _Function_handler<void_(),_fineftp::FtpSession::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.h:148:74)>
               ::_M_invoke;
          _Stack_c8._M_ptr =
               (element_type *)
               fineftp::std::
               _Function_handler<void_(),_fineftp::FtpSession::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.h:148:74)>
               ::_M_manager;
          fineftp::FtpSession::writeDataToFile
                    (pFVar9,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)&local_40,
                     (shared_ptr<fineftp::FtpSession::IoFile> *)local_a8,
                     (function<void_()> *)&local_d8);
          std::_Function_base::~_Function_base((_Function_base *)&local_d8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_refcount);
        }
        p_Var11 = &local_50;
        pFVar9 = (this->handler_).me.
                 super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        fineftp::std::__shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_50,
                     &(this->handler_).file.
                      super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>);
        fineftp::FtpSession::endDataReceiving
                  (pFVar9,(shared_ptr<fineftp::FtpSession::IoFile> *)&local_50);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_refcount);
      return;
    }
    uVar19 = 0x10000;
  }
  if (sVar20 < __new_size) {
    __new_size = sVar20;
  }
  pbVar6 = this->stream_;
  pvVar7 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
           super_mutable_buffer.data_;
  uVar21 = sVar20 - __new_size;
  if (uVar19 <= sVar20 - __new_size) {
    uVar21 = uVar19;
  }
  psVar8 = (pbVar6->
           super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ).impl_.service_;
  local_78 = &psVar8->super_reactive_socket_service_base;
  local_80 = &(pbVar6->
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ).impl_.implementation_.super_base_implementation_type;
  local_88 = &(pbVar6->
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ).impl_.executor_;
  local_d8._M_unused._M_object = this;
  peVar18 = (element_type *)asio_handler_allocate(0xf8,&this->handler_);
  sVar4 = (pbVar6->
          super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_.super_base_implementation_type.socket_;
  sVar3 = (pbVar6->
          super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_.super_base_implementation_type.state_;
  *(undefined8 *)peVar18 = 0;
  *(code **)&peVar18->field_0x8 =
       reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  *(uint *)&peVar18->field_0x10 = 0;
  uVar12 = *(undefined4 *)&(psVar8->super_reactive_socket_service_base).success_ec_.field_0x4;
  peVar10 = (psVar8->super_reactive_socket_service_base).success_ec_._M_cat;
  *(int *)&peVar18->field_0x18 = (psVar8->super_reactive_socket_service_base).success_ec_._M_value;
  *(undefined4 *)&peVar18->field_0x1c = uVar12;
  *(error_category **)&peVar18->field_0x20 = peVar10;
  *(size_t *)&peVar18->field_0x28 = 0;
  *(code **)&peVar18->field_0x30 = reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
  ;
  *(socket_type *)&peVar18->field_0x38 = sVar4;
  peVar18->field_0x3c = sVar3;
  *(ulong *)&peVar18->field_0x40 = __new_size + (long)pvVar7;
  *(ulong *)&peVar18->field_0x48 = uVar21;
  *(undefined4 *)&peVar18->field_0x50 = 0;
  local_d8._8_8_ = peVar18;
  read_op((read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
           *)&peVar18->field_0x58,this);
  handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
  ::handler_work_base((handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
                       *)&peVar18->field_0xc8,local_88);
  _Stack_c8._M_ptr = peVar18;
  reactive_socket_service_base::start_op
            (local_78,local_80,0,(reactor_op *)peVar18,start == 0,true,
             (bool)(uVar21 == 0 &
                   (pbVar6->
                   super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   ).impl_.implementation_.super_base_implementation_type.state_ >> 4));
  local_d8._8_8_ = 0;
  _Stack_c8._M_ptr = (element_type *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr((ptr *)&local_d8);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        do
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_read"));
            stream_.async_read_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(read_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
        } while (max_size > 0);

        handler_(ec, buffers_.total_consumed());
      }
    }